

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseArgs
          (Token *__return_storage_ptr__,Parser *this,ArgParams *args,string *element_kind,
          bool *got_comma)

{
  Allocator *this_00;
  Kind KVar1;
  int iVar2;
  _Self __tmp;
  ostream *poVar3;
  StaticError *this_01;
  bool bVar4;
  Fodder comma_fodder;
  Token *tok;
  Identifier *id;
  AST *expr;
  Fodder eq_fodder;
  Fodder id_fodder;
  stringstream ss;
  Token next;
  Token tok_2;
  Token tok_1;
  UString local_4a8;
  bool *local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  Token *local_470;
  Identifier *local_468;
  string *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_450;
  vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>> *local_448;
  AST *local_440;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_438;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_418;
  undefined1 local_3f8 [32];
  _Alloc_hider local_3d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [15];
  Token local_270;
  Token local_1b0;
  Token local_f0;
  
  *got_comma = false;
  local_450 = &local_f0.location.file.field_2;
  local_458 = &local_1b0.location.file.field_2;
  local_478 = local_368;
  bVar4 = true;
  local_480 = got_comma;
  local_470 = __return_storage_ptr__;
  local_460 = element_kind;
  local_448 = (vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>> *)
              args;
  do {
    Token::Token(&local_270,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    KVar1 = local_270.kind;
    if (local_270.kind == PAREN_R) {
      Token::Token(local_470,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
    }
    else {
      if ((!bVar4) && (*local_480 == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_3f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3f8 + 0x10),"expected a comma before next ",0x1d);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_3f8 + 0x10),(local_460->_M_dataplus)._M_p,
                            local_460->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
        this_01 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(this_01,&local_270.location,(string *)&local_4a8);
        __cxa_throw(this_01,&StaticError::typeinfo,StaticError::~StaticError);
      }
      local_418.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_468 = (Identifier *)0x0;
      local_438.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_438.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_438.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 10) {
        Token::Token((Token *)local_3f8,
                     (Token *)((long)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                              0x10));
        if (local_3f8._0_4_ == OPERATOR) {
          iVar2 = std::__cxx11::string::compare((char *)local_3d8);
          if (iVar2 == 0) {
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(&local_418,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)((long)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1) + 8));
            this_00 = this->alloc;
            Token::data32_abi_cxx11_
                      (&local_4a8,
                       (Token *)((this->tokens->
                                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                 )._M_impl._M_node.super__List_node_base._M_next + 1));
            local_468 = Allocator::makeIdentifier(this_00,&local_4a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
              operator_delete(local_4a8._M_dataplus._M_p,
                              local_4a8.field_2._M_allocated_capacity * 4 + 4);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(&local_438,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)(local_3f8 + 8));
            Token::Token(&local_f0,
                         (Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
            std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
            ::_M_erase(this->tokens,
                       (this->tokens->
                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                       )._M_impl._M_node.super__List_node_base._M_next);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0.location.file._M_dataplus._M_p != local_450) {
              operator_delete(local_f0.location.file._M_dataplus._M_p,
                              local_f0.location.file.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0.stringBlockTermIndent._M_dataplus._M_p !=
                &local_f0.stringBlockTermIndent.field_2) {
              operator_delete(local_f0.stringBlockTermIndent._M_dataplus._M_p,
                              local_f0.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0.stringBlockIndent._M_dataplus._M_p !=
                &local_f0.stringBlockIndent.field_2) {
              operator_delete(local_f0.stringBlockIndent._M_dataplus._M_p,
                              local_f0.stringBlockIndent.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0.data._M_dataplus._M_p != &local_f0.data.field_2) {
              operator_delete(local_f0.data._M_dataplus._M_p,
                              local_f0.data.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::~vector(&local_f0.fodder);
            Token::Token(&local_1b0,
                         (Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
            std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
            ::_M_erase(this->tokens,
                       (this->tokens->
                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                       )._M_impl._M_node.super__List_node_base._M_next);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0.location.file._M_dataplus._M_p != local_458) {
              operator_delete(local_1b0.location.file._M_dataplus._M_p,
                              local_1b0.location.file.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0.stringBlockTermIndent._M_dataplus._M_p !=
                &local_1b0.stringBlockTermIndent.field_2) {
              operator_delete(local_1b0.stringBlockTermIndent._M_dataplus._M_p,
                              local_1b0.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0.stringBlockIndent._M_dataplus._M_p !=
                &local_1b0.stringBlockIndent.field_2) {
              operator_delete(local_1b0.stringBlockIndent._M_dataplus._M_p,
                              local_1b0.stringBlockIndent.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0.data._M_dataplus._M_p != &local_1b0.data.field_2) {
              operator_delete(local_1b0.data._M_dataplus._M_p,
                              local_1b0.data.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::~vector(&local_1b0.fodder);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != local_478) {
          operator_delete(local_378._M_p,local_368[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_p != &local_388) {
          operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0]._M_p != &local_3c8) {
          operator_delete(local_3d8[0]._M_p,local_3c8._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)(local_3f8 + 8));
      }
      local_440 = parse(this,0xf);
      *local_480 = false;
      local_4a8._M_dataplus._M_p = (pointer)0x0;
      local_4a8._M_string_length = 0;
      local_4a8.field_2._M_allocated_capacity = 0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 4) {
        Token::Token((Token *)local_3f8,
                     (Token *)((this->tokens->
                               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&local_4a8,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)(local_3f8 + 8));
        *local_480 = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != local_478) {
          operator_delete(local_378._M_p,local_368[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_p != &local_388) {
          operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0]._M_p != &local_3c8) {
          operator_delete(local_3d8[0]._M_p,local_3c8._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)(local_3f8 + 8));
      }
      std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                (local_448,&local_418,&local_468,&local_438,&local_440,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&local_4a8);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&local_4a8);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_438);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_418);
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.location.file._M_dataplus._M_p != &local_270.location.file.field_2) {
      operator_delete(local_270.location.file._M_dataplus._M_p,
                      local_270.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.stringBlockTermIndent._M_dataplus._M_p !=
        &local_270.stringBlockTermIndent.field_2) {
      operator_delete(local_270.stringBlockTermIndent._M_dataplus._M_p,
                      local_270.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.stringBlockIndent._M_dataplus._M_p != &local_270.stringBlockIndent.field_2) {
      operator_delete(local_270.stringBlockIndent._M_dataplus._M_p,
                      local_270.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.data._M_dataplus._M_p != &local_270.data.field_2) {
      operator_delete(local_270.data._M_dataplus._M_p,
                      local_270.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_270.fodder);
  } while (KVar1 != PAREN_R);
  return local_470;
}

Assistant:

Token parseArgs(ArgParams &args, const std::string &element_kind, bool &got_comma)
    {
        got_comma = false;
        bool first = true;
        do {
            Token next = peek();
            if (next.kind == Token::PAREN_R) {
                // got_comma can be true or false here.
                return pop();
            }
            if (!first && !got_comma) {
                std::stringstream ss;
                ss << "expected a comma before next " << element_kind << ".";
                throw StaticError(next.location, ss.str());
            }
            // Either id=expr or id or expr, but note that expr could be id==1 so this needs
            // look-ahead.
            Fodder id_fodder;
            const Identifier *id = nullptr;
            Fodder eq_fodder;
            if (peek().kind == Token::IDENTIFIER) {
                Token maybe_eq = doublePeek();
                if (maybe_eq.kind == Token::OPERATOR && maybe_eq.data == "=") {
                    id_fodder = peek().fodder;
                    id = alloc->makeIdentifier(peek().data32());
                    eq_fodder = maybe_eq.fodder;
                    pop();  // id
                    pop();  // eq
                }
            }
            AST *expr = parse(MAX_PRECEDENCE);
            got_comma = false;
            first = false;
            Fodder comma_fodder;
            if (peek().kind == Token::COMMA) {
                Token comma = pop();
                comma_fodder = comma.fodder;
                got_comma = true;
            }
            args.emplace_back(id_fodder, id, eq_fodder, expr, comma_fodder);
        } while (true);
    }